

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_add(m2v *A,m2v *B,m2v *out)

{
  int iVar1;
  int iVar2;
  m2v_base *pmVar3;
  m2v_base *pmVar4;
  int iVar5;
  long lVar6;
  
  if (0 < A->n_row) {
    iVar5 = 0;
    do {
      iVar1 = out->row_stride;
      if (0 < iVar1) {
        iVar2 = A->row_stride;
        pmVar3 = out->e;
        pmVar4 = A->e;
        lVar6 = 0;
        do {
          pmVar3[(ulong)(uint)(iVar1 * iVar5) + lVar6] = pmVar4[(long)iVar2 * (long)iVar5 + lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 < out->row_stride);
      }
      iVar1 = out->row_stride;
      if (0 < iVar1) {
        iVar2 = B->row_stride;
        pmVar3 = out->e;
        pmVar4 = B->e;
        lVar6 = 0;
        do {
          pmVar3[(ulong)(uint)(iVar1 * iVar5) + lVar6] =
               pmVar3[(ulong)(uint)(iVar1 * iVar5) + lVar6] ^
               pmVar4[(long)iVar2 * (long)iVar5 + lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 < out->row_stride);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < A->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_add)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* out)
{
	assert(A->n_row == B->n_row);
	assert(A->n_col == B->n_col);
	assert(A->n_row == out->n_row);
	assert(A->n_col == out->n_col);

	for (int i = 0; i < A->n_row; ++i) {
		MV_GEN_N(_copy_row)(A, i, out, i);
		MV_GEN_N(_multadd_row)(B, i, 1, out, i);
	}
}